

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ga_symmetr.c
# Opt level: O2

void pnga_symmetrize(Integer g_a)

{
  undefined1 auVar1 [16];
  long lVar2;
  DoublePrecision *A;
  Integer IVar3;
  Integer IVar4;
  logical lVar5;
  long lVar6;
  double *buf;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Integer ndim;
  int local_204;
  void *a_ptr;
  double *local_1f8;
  Integer local_1f0;
  Integer alo [7];
  Integer ahi [7];
  Integer type;
  Integer bhi [7];
  Integer blo [7];
  Integer dims [7];
  Integer ldb [7];
  Integer lda [7];
  
  IVar3 = pnga_nodeid();
  iVar10 = _ga_sync_end;
  a_ptr = (void *)0x0;
  bVar20 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar20) {
    pnga_sync();
  }
  IVar4 = pnga_total_blocks(g_a);
  pnga_inquire(g_a,&type,&ndim,dims);
  if (type != 0x3ec) {
    pnga_error("ga_symmetrize: only implemented for double precision",0);
  }
  if (IVar4 < 0) {
    if (dims[ndim + -1] != blo[ndim + 6]) {
      pnga_error("ga_sym: can only sym square matrix",0);
    }
    pnga_distribution(g_a,IVar3,alo,ahi);
    bVar20 = 0 < ahi[0];
    for (lVar6 = 1; lVar6 < ndim; lVar6 = lVar6 + 1) {
      if (bVar20) {
        bVar20 = 0 < ahi[lVar6];
      }
      else {
        bVar20 = false;
      }
    }
    if (bVar20) {
      pnga_access_ptr(g_a,alo,ahi,&a_ptr,lda);
      lVar7 = 0;
      IVar3 = ndim;
      if (ndim < 1) {
        IVar3 = lVar7;
      }
      lVar6 = 1;
      for (; IVar3 != lVar7; lVar7 = lVar7 + 1) {
        lVar6 = lVar6 * ((ahi[lVar7] - alo[lVar7]) + 1);
      }
      buf = (double *)pnga_malloc(lVar6,0x3f5,"v");
      lVar8 = 0;
      lVar7 = ndim + -2;
      if (ndim + -2 < 1) {
        lVar7 = lVar8;
      }
      for (; lVar7 != lVar8; lVar8 = lVar8 + 1) {
        bhi[lVar8] = ahi[lVar8];
        blo[lVar8] = alo[lVar8];
      }
      auVar1 = *(undefined1 (*) [16])(&local_1f8 + ndim);
      auVar21._0_8_ = auVar1._8_8_;
      auVar21._8_4_ = auVar1._0_4_;
      auVar21._12_4_ = auVar1._4_4_;
      *(undefined1 (*) [16])(bhi + ndim + 6) = auVar21;
      auVar1 = *(undefined1 (*) [16])(alo + ndim + 6);
      auVar22._0_8_ = auVar1._8_8_;
      auVar22._8_4_ = auVar1._0_4_;
      auVar22._12_4_ = auVar1._4_4_;
      *(undefined1 (*) [16])(ahi + ndim + 6) = auVar22;
      lVar7 = 1;
      if (1 < ndim) {
        lVar7 = ndim;
      }
      for (lVar8 = 0; lVar7 + -1 != lVar8; lVar8 = lVar8 + 1) {
        ldb[lVar8] = (bhi[lVar8] - blo[lVar8]) + 1;
      }
      pnga_get(g_a,blo,bhi,buf,ldb);
    }
    else {
      lVar6 = 1;
      buf = (double *)0x0;
    }
    pnga_sync();
    if (bVar20) {
      lVar8 = 0;
      lVar7 = ndim + -2;
      if (ndim + -2 < 1) {
        lVar7 = lVar8;
      }
      lVar9 = 1;
      lVar11 = lVar9;
      for (; lVar7 != lVar8; lVar8 = lVar8 + 1) {
        lVar15 = (ahi[lVar8] - alo[lVar8]) + 1;
        lVar9 = lVar9 * lVar15;
        lVar11 = lVar11 * lVar15;
      }
      local_204 = iVar10;
      lVar15 = (alo[ndim + 6] - (long)(&local_1f8)[ndim]) + 1;
      lVar7 = ((ahi[ndim + -1] - alo[ndim + -1]) + 1) * lVar15;
      lVar8 = 0;
      if (lVar7 < 1) {
        lVar7 = lVar8;
      }
      pdVar13 = buf;
      lVar12 = 0;
      if (0 < lVar11) {
        lVar12 = lVar11;
      }
      for (; lVar8 != lVar12; lVar8 = lVar8 + 1) {
        lVar17 = 0;
        lVar19 = lVar8;
        lVar14 = lVar7;
        pdVar16 = pdVar13;
        while (bVar20 = lVar14 != 0, lVar14 = lVar14 + -1, bVar20) {
          lVar18 = (lVar17 + 1) * lVar11 + lVar8;
          lVar2 = lVar17 + 1;
          if (lVar19 < lVar6) {
            lVar18 = lVar19;
            lVar2 = lVar17;
          }
          lVar17 = lVar2;
          *(double *)((long)a_ptr + lVar18 * 8) =
               (*(double *)((long)a_ptr + lVar18 * 8) + *pdVar16) * 0.5;
          lVar19 = lVar18 + lVar9 * lVar15;
          pdVar16 = pdVar16 + lVar11;
        }
        pdVar13 = pdVar13 + 1;
      }
      local_1f8 = buf;
      local_1f0 = g_a;
      pnga_release_update(g_a,alo,ahi);
      pnga_free(local_1f8);
      iVar10 = local_204;
    }
  }
  else {
    ahi[0] = 0x3fe0000000000000;
    lVar5 = pnga_duplicate(g_a,alo,"A_transpose");
    if (lVar5 == 0) {
      pnga_error("ga_symmetrize: duplicate failed",0);
    }
    pnga_transpose(g_a,alo[0]);
    pnga_add(ahi,g_a,ahi,alo[0],g_a);
    pnga_destroy(alo[0]);
  }
  if (iVar10 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_symmetrize(Integer g_a) {
  
  DoublePrecision alpha = 0.5;
  Integer i, me = pnga_nodeid();
  Integer alo[GA_MAX_DIM], ahi[GA_MAX_DIM], lda[GA_MAX_DIM], nelem=1;
  Integer blo[GA_MAX_DIM], bhi[GA_MAX_DIM], ldb[GA_MAX_DIM];
  Integer ndim, dims[GA_MAX_DIM], type;
  Logical have_data;
  Integer g_b; /* temporary global array (b = A') */
  Integer num_blocks_a;
  void *a_ptr=NULL, *b_ptr=NULL;
  int local_sync_begin,local_sync_end;
  char *tempB = "A_transpose";

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  
  num_blocks_a = pnga_total_blocks(g_a);

  pnga_inquire(g_a, &type, &ndim, dims);

  if (type != C_DBL)
    pnga_error("ga_symmetrize: only implemented for double precision",0);

  if (num_blocks_a < 0) {

    if (dims[ndim-1] != dims[ndim-2]) 
      pnga_error("ga_sym: can only sym square matrix", 0L);

    /* Find the local distribution */
    pnga_distribution(g_a, me, alo, ahi);


    have_data = ahi[0]>0;
    for(i=1; i<ndim; i++) have_data = have_data && ahi[i]>0;

    if(have_data) {
      pnga_access_ptr(g_a, alo, ahi, &a_ptr, lda); 

      for(i=0; i<ndim; i++) nelem *= ahi[i]-alo[i] +1;
      b_ptr = (void *) pnga_malloc(nelem, MT_F_DBL, "v");

      for(i=0; i<ndim-2; i++) {bhi[i]=ahi[i]; blo[i]=alo[i]; }

      /* switch rows and cols */
      blo[ndim-1]=alo[ndim-2];
      bhi[ndim-1]=ahi[ndim-2];
      blo[ndim-2]=alo[ndim-1];
      bhi[ndim-2]=ahi[ndim-1];

      for (i=0; i < ndim-1; i++) 
        ldb[i] = bhi[i] - blo[i] + 1; 
      pnga_get(g_a, blo, bhi, b_ptr, ldb);
    }
    pnga_sync(); 

    if(have_data) {
      gai_add(alo, ahi, a_ptr, b_ptr, alpha, type, nelem, ndim);
      pnga_release_update(g_a, alo, ahi);
      pnga_free(b_ptr);
    }
  } else {
    /* For block-cyclic data, probably most efficient solution is to
       create duplicate copy, transpose it and add the results together */
    DoublePrecision half = 0.5;
    if (!pnga_duplicate(g_a, &g_b, tempB))
      pnga_error("ga_symmetrize: duplicate failed", 0L);
    pnga_transpose(g_a, g_b);
    pnga_add(&half, g_a, &half, g_b, g_a);
    pnga_destroy(g_b);
  }
  if(local_sync_end)pnga_sync();
}